

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppMetadataTest::CaptureMetadata
          (CppMetadataTest *this,string *filename,FileDescriptorProto *file,string *pb_h,
          GeneratedCodeInfo *pb_h_info,string *proto_h,GeneratedCodeInfo *proto_h_info,string *pb_cc
          )

{
  bool bVar1;
  char *pcVar2;
  LogMessage *pLVar3;
  AlphaNum *pAVar4;
  AlphaNum *c;
  undefined1 auVar5 [16];
  string_view filename_00;
  Status *local_860;
  Status *local_828;
  Status *local_7f8;
  AlphaNum local_7c8;
  AlphaNum local_798;
  string local_768;
  LogMessage local_748;
  Voidify local_731;
  AlphaNum local_730;
  AlphaNum local_700;
  string local_6d0;
  undefined1 local_6b0 [16];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo_2;
  AlphaNum local_668;
  string local_638;
  LogMessage local_618;
  Voidify local_601;
  AlphaNum local_600;
  AlphaNum local_5d0;
  string local_5a0;
  undefined1 local_580 [16];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo_1;
  Voidify local_551;
  AlphaNum local_550;
  AlphaNum local_520;
  string local_4f0;
  undefined1 local_4d0 [16];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo;
  string local_4a8;
  AlphaNum local_488;
  AlphaNum local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  AlphaNum local_408;
  undefined1 local_3d8 [8];
  string output_base;
  undefined1 local_3b0 [7];
  bool result;
  AlphaNum local_390;
  AlphaNum local_360;
  undefined1 local_330 [8];
  string cpp_out;
  undefined1 local_308 [88];
  undefined1 local_2b0 [8];
  CppGenerator cpp_generator;
  CommandLineInterface cli;
  string *proto_h_local;
  GeneratedCodeInfo *pb_h_info_local;
  string *pb_h_local;
  FileDescriptorProto *file_local;
  string *filename_local;
  CppMetadataTest *this_local;
  
  c = (AlphaNum *)pb_h_info;
  CommandLineInterface::CommandLineInterface
            ((CommandLineInterface *)((long)&cpp_generator.runtime_include_base_.field_2 + 8));
  CppGenerator::CppGenerator((CppGenerator *)local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_308 + 0x28),"--cpp_out",(allocator<char> *)(local_308 + 0x27));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_308,anon_var_dwarf_37cdd0 + 5,
             (allocator<char> *)(cpp_out.field_2._M_local_buf + 0xf));
  pAVar4 = (AlphaNum *)local_308;
  CommandLineInterface::RegisterGenerator
            ((CommandLineInterface *)((long)&cpp_generator.runtime_include_base_.field_2 + 8),
             (string *)(local_308 + 0x28),(CodeGenerator *)local_2b0,(string *)pAVar4);
  std::__cxx11::string::~string((string *)local_308);
  std::allocator<char>::~allocator((allocator<char> *)(cpp_out.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)(local_308 + 0x28));
  std::allocator<char>::~allocator((allocator<char> *)(local_308 + 0x27));
  absl::lts_20250127::AlphaNum::AlphaNum
            (&local_360,
             "--cpp_out=annotate_headers=true,annotation_pragma_name=pragma_name,annotation_guard_name=guard_name:"
            );
  testing::TempDir_abi_cxx11_();
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_390,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0);
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_330,(lts_20250127 *)&local_360,&local_390,pAVar4);
  std::__cxx11::string::~string((string *)local_3b0);
  output_base.field_2._M_local_buf[0xf] =
       annotation_test_util::RunProtoCompiler
                 (filename,(string *)local_330,
                  (CommandLineInterface *)((long)&cpp_generator.runtime_include_base_.field_2 + 8),
                  file);
  if (!(bool)output_base.field_2._M_local_buf[0xf]) {
    output_base.field_2._8_4_ = 1;
    this_local._7_1_ = (bool)output_base.field_2._M_local_buf[0xf];
    goto LAB_00ed257f;
  }
  testing::TempDir_abi_cxx11_();
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_408,&local_428);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_458,"/");
  auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)filename);
  filename_00._M_len = auVar5._8_8_;
  absl_log_internal_check_ok_goo.second = auVar5._0_8_;
  filename_00._M_str = (char *)file;
  StripProto_abi_cxx11_(&local_4a8,(cpp *)absl_log_internal_check_ok_goo.second,filename_00);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_488,&local_4a8);
  pAVar4 = &local_488;
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_3d8,(lts_20250127 *)&local_408,&local_458,pAVar4,c);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_428);
  if (pb_cc != (string *)0x0) {
    std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
    pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
              ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)(local_4d0 + 8));
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_520,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_550,".pb.cc");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_4f0,(lts_20250127 *)&local_520,&local_550,pAVar4);
    pAVar4 = (AlphaNum *)0x1;
    File::GetContents((string *)local_4d0,&local_4f0,SUB81(pb_cc,0));
    local_4d0._8_8_ = absl::lts_20250127::log_internal::AsStatus((Status *)local_4d0);
    bVar1 = absl::lts_20250127::Status::ok((Status *)local_4d0._8_8_);
    if (bVar1) {
      local_7f8 = (Status *)0x0;
    }
    else {
      local_7f8 = (Status *)
                  absl::lts_20250127::status_internal::MakeCheckFailString
                            ((Nonnull<const_absl::Status_*>)local_4d0._8_8_,
                             "File::GetContents(absl::StrCat(output_base, \".pb.cc\"), pb_cc, true) is OK"
                            );
    }
    absl_log_internal_check_ok_goo.first = local_7f8;
    bVar1 = absl::lts_20250127::Status::ok((Status *)local_4d0._8_8_);
    absl::lts_20250127::Status::~Status((Status *)local_4d0);
    std::__cxx11::string::~string((string *)&local_4f0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      pcVar2 = absl::lts_20250127::implicit_cast<char_const*>
                         ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo.first);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&absl_log_internal_check_ok_goo_1.second,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                 ,0x3b,pcVar2);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                         ((LogMessage *)&absl_log_internal_check_ok_goo_1.second);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_551,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&absl_log_internal_check_ok_goo_1.second);
    }
  }
  if ((pb_h == (string *)0x0) || (pb_h_info == (GeneratedCodeInfo *)0x0)) {
LAB_00ed2289:
    if ((proto_h != (string *)0x0) && (proto_h_info != (GeneratedCodeInfo *)0x0)) {
      std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
      pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
                ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)(local_6b0 + 8));
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_700,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_730,".proto.h");
      absl::lts_20250127::StrCat_abi_cxx11_(&local_6d0,(lts_20250127 *)&local_700,&local_730,pAVar4)
      ;
      pAVar4 = (AlphaNum *)0x1;
      File::GetContents((string *)local_6b0,&local_6d0,SUB81(proto_h,0));
      local_6b0._8_8_ = absl::lts_20250127::log_internal::AsStatus((Status *)local_6b0);
      bVar1 = absl::lts_20250127::Status::ok((Status *)local_6b0._8_8_);
      if (bVar1) {
        local_860 = (Status *)0x0;
      }
      else {
        local_860 = (Status *)
                    absl::lts_20250127::status_internal::MakeCheckFailString
                              ((Nonnull<const_absl::Status_*>)local_6b0._8_8_,
                               "File::GetContents(absl::StrCat(output_base, \".proto.h\"), proto_h, true) is OK"
                              );
      }
      absl_log_internal_check_ok_goo_2.first = local_860;
      bVar1 = absl::lts_20250127::Status::ok((Status *)local_6b0._8_8_);
      absl::lts_20250127::Status::~Status((Status *)local_6b0);
      std::__cxx11::string::~string((string *)&local_6d0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pcVar2 = absl::lts_20250127::implicit_cast<char_const*>
                           ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo_2.first);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_748,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                   ,0x49,pcVar2);
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_748);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_731,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_748);
      }
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_798,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_7c8,".proto.h.meta");
      absl::lts_20250127::StrCat_abi_cxx11_(&local_768,(lts_20250127 *)&local_798,&local_7c8,pAVar4)
      ;
      bVar1 = annotation_test_util::DecodeMetadata(&local_768,proto_h_info);
      std::__cxx11::string::~string((string *)&local_768);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = false;
        goto LAB_00ed2563;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
    pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
              ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)(local_580 + 8));
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_5d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_600,".pb.h");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_5a0,(lts_20250127 *)&local_5d0,&local_600,pAVar4);
    pAVar4 = (AlphaNum *)0x1;
    File::GetContents((string *)local_580,&local_5a0,SUB81(pb_h,0));
    local_580._8_8_ = absl::lts_20250127::log_internal::AsStatus((Status *)local_580);
    bVar1 = absl::lts_20250127::Status::ok((Status *)local_580._8_8_);
    if (bVar1) {
      local_828 = (Status *)0x0;
    }
    else {
      local_828 = (Status *)
                  absl::lts_20250127::status_internal::MakeCheckFailString
                            ((Nonnull<const_absl::Status_*>)local_580._8_8_,
                             "File::GetContents(absl::StrCat(output_base, \".pb.h\"), pb_h, true) is OK"
                            );
    }
    absl_log_internal_check_ok_goo_1.first = local_828;
    bVar1 = absl::lts_20250127::Status::ok((Status *)local_580._8_8_);
    absl::lts_20250127::Status::~Status((Status *)local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      pcVar2 = absl::lts_20250127::implicit_cast<char_const*>
                         ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo_1.first);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_618,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                 ,0x40,pcVar2);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_618);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_601,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_618);
    }
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_668,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
    absl::lts_20250127::AlphaNum::AlphaNum
              ((AlphaNum *)&absl_log_internal_check_ok_goo_2.second,".pb.h.meta");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_638,(lts_20250127 *)&local_668,
               (AlphaNum *)&absl_log_internal_check_ok_goo_2.second,pAVar4);
    bVar1 = annotation_test_util::DecodeMetadata(&local_638,pb_h_info);
    std::__cxx11::string::~string((string *)&local_638);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00ed2289;
    this_local._7_1_ = false;
  }
LAB_00ed2563:
  output_base.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)local_3d8);
LAB_00ed257f:
  std::__cxx11::string::~string((string *)local_330);
  CppGenerator::~CppGenerator((CppGenerator *)local_2b0);
  CommandLineInterface::~CommandLineInterface
            ((CommandLineInterface *)((long)&cpp_generator.runtime_include_base_.field_2 + 8));
  return this_local._7_1_;
}

Assistant:

bool CaptureMetadata(const std::string& filename, FileDescriptorProto* file,
                       std::string* pb_h, GeneratedCodeInfo* pb_h_info,
                       std::string* proto_h, GeneratedCodeInfo* proto_h_info,
                       std::string* pb_cc) {
    CommandLineInterface cli;
    CppGenerator cpp_generator;
    cli.RegisterGenerator("--cpp_out", &cpp_generator, "");
    std::string cpp_out = absl::StrCat(
        "--cpp_out=annotate_headers=true,"
        "annotation_pragma_name=pragma_name,"
        "annotation_guard_name=guard_name:",
        ::testing::TempDir());

    const bool result = atu::RunProtoCompiler(filename, cpp_out, &cli, file);

    if (!result) {
      return result;
    }

    std::string output_base =
        absl::StrCat(::testing::TempDir(), "/", StripProto(filename));

    if (pb_cc != nullptr) {
      ABSL_CHECK_OK(File::GetContents(absl::StrCat(output_base, ".pb.cc"),
                                      pb_cc, true));
    }

    if (pb_h != nullptr && pb_h_info != nullptr) {
      ABSL_CHECK_OK(File::GetContents(absl::StrCat(output_base, ".pb.h"), pb_h,
                                      true));
      if (!atu::DecodeMetadata(absl::StrCat(output_base, ".pb.h.meta"),
                               pb_h_info)) {
        return false;
      }
    }

    if (proto_h != nullptr && proto_h_info != nullptr) {
      ABSL_CHECK_OK(File::GetContents(absl::StrCat(output_base, ".proto.h"),
                                      proto_h, true));
      if (!atu::DecodeMetadata(absl::StrCat(output_base, ".proto.h.meta"),
                               proto_h_info)) {
        return false;
      }
    }

    return true;
  }